

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

QString * runCommandAsUserArgs(QString *__return_storage_ptr__,QString *cmd)

{
  long in_FS_OFFSET;
  QAnyStringView QVar1;
  undefined1 local_80 [8];
  char16_t *local_78;
  ulong local_70;
  undefined1 local_68 [8];
  char16_t *local_60;
  ulong local_58;
  undefined1 local_50 [8];
  char16_t *local_48;
  ulong local_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined8 uStack_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = g_options.package.d.size | 0x8000000000000000;
  local_38 = local_50;
  local_50[0] = 1;
  local_48 = g_options.package.d.ptr;
  local_58 = g_testInfo.userId.d.size | 0x8000000000000000;
  puStack_30 = local_68;
  local_68[0] = 1;
  local_60 = g_testInfo.userId.d.ptr;
  local_78 = (cmd->d).ptr;
  local_70 = (cmd->d).size | 0x8000000000000000;
  local_28 = local_80;
  local_80[0] = 1;
  uStack_20 = 0;
  QVar1.m_size = (size_t)"run-as %1 --user %2 %3";
  QVar1.field_0.m_data = __return_storage_ptr__;
  QtPrivate::argToQString(QVar1,0x4000000000000016,(ArgBase **)0x3);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QString runCommandAsUserArgs(const QString &cmd)
{
    return "run-as %1 --user %2 %3"_L1.arg(g_options.package, g_testInfo.userId, cmd);
}